

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O2

bool __thiscall pbrt::Triangle::IntersectP(Triangle *this,Ray *ray,Float tMax)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long in_FS_OFFSET;
  Point3f p0;
  Point3f p1;
  Point3f p2;
  optional<pbrt::TriangleIntersection> isect;
  optional<pbrt::TriangleIntersection> local_1c;
  
  lVar1 = allMeshes;
  *(long *)(in_FS_OFFSET + -0x3f0) = *(long *)(in_FS_OFFSET + -0x3f0) + 1;
  lVar1 = *(long *)(*(long *)(lVar1 + 8) + (long)this->meshIndex * 8);
  lVar5 = *(long *)(lVar1 + 8);
  lVar2 = (long)this->triIndex * 0xc;
  lVar1 = *(long *)(lVar1 + 0x10);
  lVar4 = (long)*(int *)(lVar5 + lVar2) * 0xc;
  lVar3 = (long)*(int *)(lVar5 + 8 + lVar2) * 0xc;
  lVar5 = (long)*(int *)(lVar5 + 4 + lVar2) * 0xc;
  p0.super_Tuple3<pbrt::Point3,_float>.z = *(float *)(lVar1 + 8 + lVar4);
  p0.super_Tuple3<pbrt::Point3,_float>._0_8_ = *(undefined8 *)(lVar1 + lVar4);
  p1.super_Tuple3<pbrt::Point3,_float>.z = *(float *)(lVar1 + 8 + lVar5);
  p1.super_Tuple3<pbrt::Point3,_float>._0_8_ = *(undefined8 *)(lVar1 + lVar5);
  p2.super_Tuple3<pbrt::Point3,_float>.z = *(float *)(lVar1 + 8 + lVar3);
  p2.super_Tuple3<pbrt::Point3,_float>._0_8_ = *(undefined8 *)(lVar1 + lVar3);
  IntersectTriangle(&local_1c,ray,tMax,p0,p1,p2);
  if (local_1c.set == true) {
    *(long *)(in_FS_OFFSET + -1000) = *(long *)(in_FS_OFFSET + -1000) + 1;
  }
  pstd::optional<pbrt::TriangleIntersection>::~optional(&local_1c);
  return local_1c.set;
}

Assistant:

bool Triangle::IntersectP(const Ray &ray, Float tMax) const {
#ifndef PBRT_IS_GPU_CODE
    ++nTriTests;
#endif
    // Get triangle vertices in _p0_, _p1_, and _p2_
    const TriangleMesh *mesh = GetMesh();
    const int *v = &mesh->vertexIndices[3 * triIndex];
    Point3f p0 = mesh->p[v[0]], p1 = mesh->p[v[1]], p2 = mesh->p[v[2]];

    pstd::optional<TriangleIntersection> isect = IntersectTriangle(ray, tMax, p0, p1, p2);
    if (isect) {
#ifndef PBRT_IS_GPU_CODE
        ++nTriHits;
#endif
        return true;
    } else
        return false;
}